

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O1

bool __thiscall
dg::pta::LLVMPointerGraphBuilder::addFunctionToJoin
          (LLVMPointerGraphBuilder *this,PSNode *function,PSNodeJoin *joinNode)

{
  Function *F;
  PointerSubgraph *pPVar1;
  _Rb_tree_node_base *p_Var2;
  PSNode *pPVar3;
  PSNode *phi;
  PSNode *local_38;
  PSNode *local_30;
  
  pPVar3 = (joinNode->super_PSNode).pairedNode;
  local_38 = function;
  std::
  _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
  ::_M_insert_unique<dg::pta::PSNode*const&>
            ((_Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
              *)&joinNode->functions_,&local_38);
  F = (Function *)(function->super_SubgraphNode<dg::pta::PSNode>).user_data;
  if (*(Function **)(F + 0x48) != F + 0x48) {
    pPVar1 = getSubgraph(this,F);
    if ((pPVar3->super_SubgraphNode<dg::pta::PSNode>).operands.
        super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
        super__Vector_impl_data._M_start[1]->type == NULL_ADDR) {
      for (p_Var2 = (pPVar1->returnNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(pPVar1->returnNodes)._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        SubgraphNode<dg::pta::PSNode>::addSuccessor
                  ((SubgraphNode<dg::pta::PSNode> *)(*(long *)(p_Var2 + 1) + 8),
                   &joinNode->super_PSNode);
      }
    }
    else {
      local_38 = PointerGraph::create<(dg::pta::PSNodeType)5>((PointerGraph *)this);
      local_30 = (pPVar3->super_SubgraphNode<dg::pta::PSNode>).operands.
                 super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
      pPVar3 = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*>
                         ((PointerGraph *)this,&local_38,&local_30);
      SubgraphNode<dg::pta::PSNode>::addSuccessor
                (&local_38->super_SubgraphNode<dg::pta::PSNode>,pPVar3);
      SubgraphNode<dg::pta::PSNode>::addSuccessor
                (&pPVar3->super_SubgraphNode<dg::pta::PSNode>,&joinNode->super_PSNode);
      for (p_Var2 = (pPVar1->returnNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(pPVar1->returnNodes)._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        pPVar3 = *(PSNode **)(p_Var2 + 1);
        SubgraphNode<dg::pta::PSNode>::addSuccessor
                  (&pPVar3->super_SubgraphNode<dg::pta::PSNode>,local_38);
        SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
                  (&local_38->super_SubgraphNode<dg::pta::PSNode>,pPVar3);
      }
    }
  }
  return true;
}

Assistant:

bool LLVMPointerGraphBuilder::addFunctionToJoin(PSNode *function,
                                                PSNodeJoin *joinNode) {
    PSNode *CInst = joinNode->getPairedNode();
    joinNode->addFunction(function);
    const llvm::Function *F = function->getUserData<llvm::Function>();

    if (!F->empty()) {
        PointerSubgraph *subgraph = getSubgraph(F);
        assert(subgraph && "Did not build the subgraph for thread");

        DBG(pta, "Found a new join point for function '" << F->getName().str()
                                                         << "'");
        if (!CInst->getOperand(1)->isNull()) {
            PSNode *phi = PS.create<PSNodeType::PHI>();
            PSNode *store =
                    PS.create<PSNodeType::STORE>(phi, CInst->getOperand(1));
            phi->addSuccessor(store);
            store->addSuccessor(joinNode);
            for (PSNode *ret : subgraph->returnNodes) {
                ret->addSuccessor(phi);
                phi->addOperand(ret);
            }
        } else {
            for (PSNode *ret : subgraph->returnNodes) {
                ret->addSuccessor(joinNode);
            }
        }
    }
    return true;
}